

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::ParameterParameter::InternalSerializeWithCachedSizesToArray
          (ParameterParameter *this,bool deterministic,uint8 *target)

{
  BlobShape *this_00;
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  uint8 *puVar4;
  uint uVar5;
  byte *pbVar6;
  
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    this_00 = this->shape_;
    *target = '\n';
    pbVar6 = target + 1;
    uVar5 = this_00->_cached_size_;
    uVar3 = uVar5;
    if (0x7f < uVar5) {
      do {
        *pbVar6 = (byte)uVar5 | 0x80;
        uVar3 = uVar5 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar2 = 0x3fff < uVar5;
        uVar5 = uVar3;
      } while (bVar2);
    }
    *pbVar6 = (byte)uVar3;
    target = BlobShape::InternalSerializeWithCachedSizesToArray(this_00,false,pbVar6 + 1);
  }
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe),target);
    return puVar4;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* ParameterParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.ParameterParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.BlobShape shape = 1;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        1, *this->shape_, deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.ParameterParameter)
  return target;
}